

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppUnitTest.h
# Opt level: O0

void Microsoft::VisualStudio::CppUnitTestFramework::Assert::AreEqual<Centaurus::CharClass<char>>
               (CharClass<char> *expected,CharClass<char> *actual,wchar_t *message)

{
  bool bVar1;
  wostream *pwVar2;
  CharClass<char> *val;
  CharClass<char> *val_00;
  CharClass<char> local_b0;
  wstring local_90;
  CharClass<char> local_60;
  wstring local_40;
  wchar_t *local_20;
  wchar_t *message_local;
  CharClass<char> *actual_local;
  CharClass<char> *expected_local;
  
  local_20 = message;
  message_local = (wchar_t *)actual;
  actual_local = expected;
  bVar1 = Equals<Centaurus::CharClass<char>>(expected,actual);
  if (!bVar1) {
    pwVar2 = std::operator<<((wostream *)&std::wcerr,L"Assert failed. Expected:");
    Centaurus::CharClass<char>::CharClass(&local_60,actual_local);
    ToString<Centaurus::CharClass<char>>(&local_40,(Assert *)&local_60,val);
    pwVar2 = std::operator<<(pwVar2,(wstring *)&local_40);
    pwVar2 = std::operator<<(pwVar2,L" Actual:");
    Centaurus::CharClass<char>::CharClass(&local_b0,(CharClass<char> *)message_local);
    ToString<Centaurus::CharClass<char>>(&local_90,(Assert *)&local_b0,val_00);
    pwVar2 = std::operator<<(pwVar2,(wstring *)&local_90);
    std::wostream::operator<<(pwVar2,std::endl<wchar_t,std::char_traits<wchar_t>>);
    std::__cxx11::wstring::~wstring((wstring *)&local_90);
    Centaurus::CharClass<char>::~CharClass(&local_b0);
    std::__cxx11::wstring::~wstring((wstring *)&local_40);
    Centaurus::CharClass<char>::~CharClass(&local_60);
    if (local_20 != (wchar_t *)0x0) {
      pwVar2 = std::operator<<((wostream *)&std::wcerr,local_20);
      std::wostream::operator<<(pwVar2,std::endl<wchar_t,std::char_traits<wchar_t>>);
    }
    exit(1);
  }
  return;
}

Assistant:

static void AreEqual(const T& expected, const T& actual, const wchar_t *message = NULL)
    {
        if (!Equals(expected, actual))
        {
            std::wcerr << L"Assert failed. Expected:" << ToString(expected) << L" Actual:" << ToString(actual) << std::endl;
            if (message != NULL)
                std::wcerr << message << std::endl;
            exit(EXIT_FAILURE);
        }
    }